

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_168b90f::TestImage<unsigned_short>::TestImage
          (TestImage<unsigned_short> *this,int w_src,int h,int superres_denom,int x0,int bd)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  TestImage<unsigned_short> *in_stack_ffffffffffffffa0;
  int *__new_size;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_00;
  
  *in_RDI = in_ESI;
  in_RDI[2] = in_EDX;
  in_RDI[3] = in_ECX;
  in_RDI[4] = in_R8D;
  in_RDI[5] = in_R9D;
  __new_size = in_RDI + 8;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0xd962f1);
  this_00 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xe);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0xd96304);
  in_RDI[1] = *in_RDI;
  calculate_unscaled_superres_size(in_RDI + 1,in_ECX);
  in_RDI[6] = *in_RDI + 0x4fU & 0xfffffff0;
  in_RDI[7] = in_RDI[1] + 0x4fU & 0xfffffff0;
  src_block_size(in_stack_ffffffffffffffa0);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (this_00,(size_type)__new_size);
  dst_block_size((TestImage<unsigned_short> *)(in_RDI + 0xe));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (this_00,(size_type)__new_size);
  return;
}

Assistant:

TestImage(int w_src, int h, int superres_denom, int x0, int bd)
      : w_src_(w_src), h_(h), superres_denom_(superres_denom), x0_(x0),
        bd_(bd) {
    assert(bd < 16);
    assert(bd <= 8 * static_cast<int>(sizeof(Pixel)));
    assert(9 <= superres_denom && superres_denom <= 16);
    assert(SCALE_NUMERATOR == 8);
    assert(0 <= x0_ && x0_ <= RS_SCALE_SUBPEL_MASK);

    w_dst_ = w_src_;
    calculate_unscaled_superres_size(&w_dst_, superres_denom);

    src_stride_ = ALIGN_POWER_OF_TWO(w_src_ + 2 * kHPad, 4);
    dst_stride_ = ALIGN_POWER_OF_TWO(w_dst_ + 2 * kHPad, 4);

    // Allocate image data
    src_data_.resize(2 * src_block_size());
    dst_data_.resize(2 * dst_block_size());
  }